

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O1

page * __thiscall cppcms::impl::buddy_allocator::page_alloc(buddy_allocator *this,int bit_size)

{
  undefined8 *puVar1;
  page *ppVar2;
  page *ppVar3;
  long lVar4;
  
  if (this->max_bit_size_ < bit_size) {
    return (page *)0x0;
  }
  ppVar3 = this->free_list_[bit_size];
  if (ppVar3 == (page *)0x0) {
    ppVar3 = page_alloc(this,bit_size + 1);
    if (ppVar3 == (page *)0x0) {
      return (page *)0x0;
    }
    lVar4 = 1L << ((byte)bit_size & 0x3f);
    puVar1 = (undefined8 *)((long)&ppVar3->next + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(int *)((long)&ppVar3->bits + lVar4) = bit_size;
    this->free_list_[bit_size] = (page *)((long)&ppVar3->bits + lVar4);
  }
  else {
    ppVar2 = ppVar3->next;
    this->free_list_[bit_size] = ppVar2;
    if (ppVar2 != (page *)0x0) {
      ppVar2->prev = (page *)0x0;
    }
  }
  ppVar3->next = (page *)0x0;
  ppVar3->prev = (page *)0x0;
  ppVar3->bits = bit_size + 0x100;
  return ppVar3;
}

Assistant:

page *page_alloc(int bit_size)
	{
		LOG("Allocating page %d bits",bit_size);
		if(bit_size > max_bit_size_) {
			LOG("Too big size requested %d > %d",bit_size,max_bit_size_);
			return 0;
		}

		page *result = 0;
		
		if(free_list_[bit_size]==0) {
			LOG("No page for bits %d, splitting",bit_size);
			page *to_split = page_alloc(bit_size + 1);
			if(!to_split)
				return 0;

			page *unused = reinterpret_cast<page *>(reinterpret_cast<char *>(to_split) + (size_t(1)<<bit_size));

			unused->prev = 0;
			unused->next = 0;
			unused->bits = bit_size;
			

			free_list_[bit_size] = unused;

			result = to_split;
			LOG("Got %zx; %zx is spare",(char*)to_split - memory(),(char*)unused - memory());
		}
		else {
			result = free_list_[bit_size];
			free_list_[bit_size]=result->next;
			if(free_list_[bit_size]) 
				free_list_[bit_size]->prev = 0;
			LOG("Using free page %zx, disconnecting",(char*)result - memory());
		}

		result->next = 0;
		result->prev = 0;
		result->bits = bit_size + page_in_use;
		LOG("Result is %zx",(char*)result - memory());
		return result;
	}